

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_start.c
# Opt level: O0

int str_start(char *s,char *t)

{
  char *pcVar1;
  char *pcVar2;
  char *pcStack_20;
  char x;
  char *t_local;
  char *s_local;
  
  pcStack_20 = t;
  t_local = s;
  do {
    if (*pcStack_20 == '\0') {
      return 1;
    }
    if (*pcStack_20 != *t_local) {
      return 0;
    }
    if (pcStack_20[1] == '\0') {
      return 1;
    }
    if (pcStack_20[1] != t_local[1]) {
      return 0;
    }
    pcVar1 = pcStack_20 + 3;
    if (pcStack_20[2] == '\0') {
      return 1;
    }
    pcVar2 = t_local + 3;
    if (pcStack_20[2] != t_local[2]) {
      return 0;
    }
    pcStack_20 = pcStack_20 + 4;
    if (*pcVar1 == '\0') {
      return 1;
    }
    t_local = t_local + 4;
  } while (*pcVar1 == *pcVar2);
  return 0;
}

Assistant:

int str_start(register const char *s,register const char *t)
{
  register char x;

  for (;;) {
    x = *t++; if (!x) return 1; if (x != *s++) return 0;
    x = *t++; if (!x) return 1; if (x != *s++) return 0;
    x = *t++; if (!x) return 1; if (x != *s++) return 0;
    x = *t++; if (!x) return 1; if (x != *s++) return 0;
  }
}